

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFactoryRegistry.cpp
# Opt level: O0

void __thiscall
CppUnit::TestFactoryRegistry::TestFactoryRegistry(TestFactoryRegistry *this,string *name)

{
  string *name_local;
  TestFactoryRegistry *this_local;
  
  TestFactory::TestFactory(&this->super_TestFactory);
  (this->super_TestFactory)._vptr_TestFactory = (_func_int **)&PTR__TestFactoryRegistry_001a1f90;
  (this->m_factories)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this->m_factories)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_factories)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_factories)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  *(undefined8 *)&(this->m_factories)._M_t._M_impl = 0;
  *(undefined8 *)&(this->m_factories)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  std::
  set<CppUnit::TestFactory_*,_std::less<CppUnit::TestFactory_*>,_std::allocator<CppUnit::TestFactory_*>_>
  ::set(&this->m_factories);
  std::__cxx11::string::string((string *)&this->m_name,(string *)name);
  return;
}

Assistant:

TestFactoryRegistry::TestFactoryRegistry( std::string name ) :
    m_factories(),
    m_name( name )
{
}